

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  size_t sVar8;
  FILE *__stream;
  byte *__s;
  byte *__s_00;
  byte *pbVar9;
  byte *pbVar10;
  undefined8 uVar11;
  byte *pbVar12;
  char *pcVar13;
  char *pcVar14;
  int iVar15;
  command_info *cmdinfo;
  char envr [256];
  byte local_238 [520];
  
  putchar(10);
  iVar4 = PHYSFS_init(*argv);
  if (iVar4 == 0) {
    uVar11 = PHYSFS_getLastError();
    printf("PHYSFS_init() failed!\n  reason: %s.\n",uVar11);
    return 1;
  }
  PHYSFS_getLinkedVersion(local_238);
  printf("test_physfs version %d.%d.%d.\n Compiled against PhysicsFS version %d.%d.%d,\n and linked against %d.%d.%d.\n\n"
         ,3,0,0,3,0,0,(uint)local_238[0],(uint)local_238[1],(uint)local_238[2]);
  plVar6 = (long *)PHYSFS_supportedArchiveTypes();
  puts("Supported archive types:");
  puVar7 = (undefined8 *)*plVar6;
  if (puVar7 == (undefined8 *)0x0) {
    puts(" * Apparently, NONE!");
  }
  else {
    while (puVar7 != (undefined8 *)0x0) {
      printf(" * %s: %s\n    Written by %s.\n    %s\n",*puVar7,puVar7[1],puVar7[2],puVar7[3]);
      pcVar14 = "Supports";
      if (*(int *)(*plVar6 + 0x20) == 0) {
        pcVar14 = "Does not support";
      }
      printf("    %s symbolic links.\n",pcVar14);
      puVar7 = (undefined8 *)plVar6[1];
      plVar6 = plVar6 + 1;
    }
  }
  putchar(10);
  pcVar14 = (char *)PHYSFS_getUserDir();
  strcpy(envr,pcVar14);
  sVar8 = strlen(envr);
  builtin_strncpy(envr + sVar8,".testphys_history",0x12);
  iVar4 = access(envr,0);
  if (iVar4 == 0) {
    __stream = fopen(envr,"r");
    if (__stream != (FILE *)0x0) {
      do {
        pcVar14 = fgets((char *)local_238,0x200,__stream);
        if (pcVar14 == (char *)0x0) break;
        sVar8 = strlen((char *)local_238);
        if (local_238[sVar8 - 1] == 10) {
          envr[sVar8 + 0xff] = '\0';
        }
        add_history(local_238);
        iVar4 = feof(__stream);
      } while (iVar4 == 0);
      fclose(__stream);
      goto LAB_00103758;
    }
    pcVar14 = 
    "\n\nCould not open history file [%s] for reading!\n  Will not have past history available.\n\n"
    ;
  }
  else {
LAB_00103758:
    history_file = (FILE *)fopen(envr,"ab");
    if ((FILE *)history_file != (FILE *)0x0) goto LAB_00103791;
    pcVar14 = 
    "\n\nCould not open history file [%s] for appending!\n  Will not be able to record this session\'s history.\n\n"
    ;
  }
  printf(pcVar14);
LAB_00103791:
  puts("Enter commands. Enter \"help\" for instructions.");
  fflush(_stdout);
LAB_001037b1:
  __s = (byte *)readline("> ");
  if (__s != (byte *)0x0) {
    sVar8 = strlen((char *)__s);
    __s_00 = (byte *)malloc(sVar8 + 1);
    if (__s_00 == (byte *)0x0) {
      puts("\n\n\nOUT OF MEMORY!\n\n");
      goto LAB_00103971;
    }
    bVar3 = false;
    pbVar12 = __s_00;
    pbVar10 = __s;
    iVar4 = 0;
LAB_001037f3:
    pbVar9 = pbVar10 + 1;
    bVar1 = *pbVar10;
    iVar5 = 1;
    pbVar10 = pbVar9;
    if (bVar1 == 0x20) goto LAB_00103814;
    iVar15 = 0;
    if (bVar1 != 0) goto LAB_00103806;
    *pbVar12 = 0;
    pcVar14 = strchr((char *)__s_00,0x20);
    if (pcVar14 == (char *)0x0) {
      pcVar14 = (char *)0x0;
    }
    else {
      *pcVar14 = '\0';
      pcVar14 = pcVar14 + 1;
    }
    if (*__s_00 != 0) {
      for (cmdinfo = commands; cmdinfo->cmd != (char *)0x0; cmdinfo = cmdinfo + 1) {
        iVar4 = strcmp(cmdinfo->cmd,(char *)__s_00);
        if (iVar4 == 0) {
          if (cmdinfo->argcount < 0) goto LAB_001038e7;
          iVar4 = 0;
          if (pcVar14 == (char *)0x0) goto LAB_001038e3;
          bVar3 = false;
          pcVar13 = pcVar14;
          goto LAB_001038ad;
        }
      }
      puts("Unknown command. Enter \"help\" for instructions.");
      goto LAB_00103906;
    }
    goto LAB_00103937;
  }
  putchar(10);
LAB_00103971:
  fflush(_stdout);
  free(__s);
  goto LAB_00103982;
LAB_00103814:
  if (((*pbVar9 & 0xdf) != 0) && (iVar15 = iVar5, iVar4 == 0 && bVar3)) {
LAB_00103806:
    *pbVar12 = bVar1;
    pbVar12 = pbVar12 + 1;
    bVar3 = true;
    iVar4 = iVar15;
  }
  goto LAB_001037f3;
LAB_001038ad:
  cVar2 = *pcVar13;
  if (cVar2 == '\"') {
    bVar3 = !bVar3;
  }
  else {
    if (cVar2 == '\0') goto LAB_001038e1;
    iVar4 = iVar4 + (uint)(!bVar3 && cVar2 == ' ');
  }
  pcVar13 = pcVar13 + 1;
  goto LAB_001038ad;
LAB_001038e1:
  iVar4 = iVar4 + 1;
LAB_001038e3:
  if (iVar4 == cmdinfo->argcount) {
LAB_001038e7:
    iVar5 = (*cmdinfo->func)(pcVar14);
  }
  else {
    output_usage("usage:",cmdinfo);
  }
LAB_00103906:
  add_history(__s);
  if (history_file != (FILE *)0x0) {
    fprintf((FILE *)history_file,"%s\n",__s);
    fflush((FILE *)history_file);
  }
LAB_00103937:
  free(__s_00);
  fflush(_stdout);
  free(__s);
  if (iVar5 == 0) {
LAB_00103982:
    iVar4 = PHYSFS_deinit();
    if (iVar4 == 0) {
      uVar11 = PHYSFS_getLastError();
      printf("PHYSFS_deinit() failed!\n  reason: %s.\n",uVar11);
    }
    if (history_file != (FILE *)0x0) {
      fclose((FILE *)history_file);
    }
    return 0;
  }
  goto LAB_001037b1;
}

Assistant:

int main(int argc, char **argv)
{
    char *buf = NULL;
    int rc = 0;

#if (defined __MWERKS__)
    extern tSIOUXSettings SIOUXSettings;
    SIOUXSettings.asktosaveonclose = 0;
    SIOUXSettings.autocloseonquit = 1;
    SIOUXSettings.rows = 40;
    SIOUXSettings.columns = 120;
#endif

    printf("\n");

    if (!PHYSFS_init(argv[0]))
    {
        printf("PHYSFS_init() failed!\n  reason: %s.\n", PHYSFS_getLastError());
        return 1;
    } /* if */

    output_versions();
    output_archivers();

    open_history_file();

    printf("Enter commands. Enter \"help\" for instructions.\n");
    fflush(stdout);

    do
    {
#if (defined PHYSFS_HAVE_READLINE)
        buf = readline("> ");
#else
        int i;
        buf = (char *) malloc(512);
        memset(buf, '\0', 512);
        printf("> ");
        fflush(stdout);
        for (i = 0; i < 511; i++)
        {
            int ch = fgetc(stdin);
            if (ch == EOF)
            {
                strcpy(buf, "quit");
                break;
            } /* if */
            else if ((ch == '\n') || (ch == '\r'))
            {
                buf[i] = '\0';
                break;
            } /* else if */
            else if (ch == '\b')
            {
                if (i > 0)
                    i--;
            } /* else if */
            else
            {
                buf[i] = (char) ch;
            } /* else */
        } /* for */
#endif

        rc = process_command(buf);
        fflush(stdout);
        if (buf != NULL)
            free(buf);
    } while (rc);

    if (!PHYSFS_deinit())
        printf("PHYSFS_deinit() failed!\n  reason: %s.\n", PHYSFS_getLastError());

    if (history_file)
        fclose(history_file);

/*
    printf("\n\ntest_physfs written by ryan c. gordon.\n");
    printf(" it makes you shoot teh railgun bettar.\n");
*/

    return 0;
}